

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParserTester_1000_1999.cpp
# Opt level: O2

void __thiscall psy::C::ParserTester::case1705(ParserTester *this)

{
  Expectation *pEVar1;
  initializer_list<psy::C::SyntaxKind> __l;
  allocator_type local_1c2;
  allocator<char> local_1c1;
  _Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> local_1c0;
  string local_1a8;
  SyntaxKind local_188 [8];
  Expectation local_178;
  Expectation local_c0;
  
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"( unsigned long ) - x",&local_1c1);
  Expectation::Expectation(&local_178);
  local_188[0] = CastExpression;
  local_188[1] = TypeName;
  local_188[2] = BasicTypeSpecifier;
  local_188[3] = BasicTypeSpecifier;
  local_188[4] = AbstractDeclarator;
  local_188[5] = UnaryMinusExpression;
  local_188[6] = 0x432;
  __l._M_len = 7;
  __l._M_array = local_188;
  std::vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::vector
            ((vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)&local_1c0,__l,
             &local_1c2);
  pEVar1 = Expectation::AST(&local_178,
                            (vector<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_> *)
                            &local_1c0);
  Expectation::Expectation(&local_c0,pEVar1);
  parseExpression(this,&local_1a8,&local_c0);
  Expectation::~Expectation(&local_c0);
  std::_Vector_base<psy::C::SyntaxKind,_std::allocator<psy::C::SyntaxKind>_>::~_Vector_base
            (&local_1c0);
  Expectation::~Expectation(&local_178);
  std::__cxx11::string::~string((string *)&local_1a8);
  return;
}

Assistant:

void ParserTester::case1705()
{
    parseExpression("( unsigned long ) - x",
                    Expectation().AST({ SyntaxKind::CastExpression,
                                        SyntaxKind::TypeName,
                                        SyntaxKind::BasicTypeSpecifier,
                                        SyntaxKind::BasicTypeSpecifier,
                                        SyntaxKind::AbstractDeclarator,
                                        SyntaxKind::UnaryMinusExpression,
                                        SyntaxKind::IdentifierName }));
}